

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID ImGui::GetIDWithSeed(char *str,char *str_end,ImGuiID seed)

{
  ImU32 id_00;
  ImU32 in_EDX;
  long in_RSI;
  char *in_RDI;
  ImGuiID id;
  undefined8 local_28;
  
  if (in_RSI == 0) {
    local_28 = 0;
  }
  else {
    local_28 = in_RSI - (long)in_RDI;
  }
  id_00 = ImHashStr(in_RDI,local_28,in_EDX);
  KeepAliveID(id_00);
  return id_00;
}

Assistant:

ImGuiID ImGui::GetIDWithSeed(const char* str, const char* str_end, ImGuiID seed)
{
    ImGuiID id = ImHashStr(str, str_end ? (str_end - str) : 0, seed);
    ImGui::KeepAliveID(id);
#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiContext& g = *GImGui;
    IMGUI_TEST_ENGINE_ID_INFO2(id, ImGuiDataType_String, str, str_end);
#endif
    return id;
}